

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O3

_Bool borg_excavate_vault(wchar_t range)

{
  int iVar1;
  chunk_conflict *c;
  _Bool _Var2;
  wchar_t wVar3;
  loc_conflict lVar5;
  uint uVar4;
  loc grid;
  loc_conflict lVar6;
  ulong uVar7;
  term *ptVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  borg_temp_n = 0;
  if ((vault_on_level) &&
     ((_Var2 = borg_spell_okay_fail(TURN_STONE_TO_MUD,L'\x1e'), _Var2 ||
      (_Var2 = borg_spell_okay_fail(SHATTER_STONE,L'\x1e'), _Var2)))) {
    ptVar8 = Term;
    wVar3 = w_y;
    for (uVar13 = (ulong)w_y; iVar1 = ptVar8->sidebar_mode,
        (long)uVar13 <
        (long)((ptVar8->hgt - (row_top_map[iVar1] + row_bottom_map[iVar1])) / (int)(uint)tile_height
              + wVar3); uVar13 = uVar13 + 1) {
      if (0 < (~col_map[iVar1] + ptVar8->wid) / (int)(uint)tile_width) {
        uVar14 = (ulong)w_x;
        do {
          lVar5 = loc((int)uVar14,(int)uVar13);
          lVar6.y = borg.c.y;
          lVar6.x = borg.c.x;
          wVar3 = distance(lVar6,lVar5);
          if ((wVar3 <= range) && ((byte)(borg_grids[uVar13][uVar14].feat - 0x10) < 6)) {
            lVar10 = 0;
            do {
              c = cave;
              lVar11 = (long)ddx_ddd[lVar10] + (long)(int)uVar14;
              lVar12 = (long)ddy_ddd[lVar10] + (long)(int)uVar13;
              grid = (loc)loc((int)lVar11,(int)lVar12);
              _Var2 = square_in_bounds_fully(c,grid);
              if ((_Var2) && (borg_grids[lVar12][lVar11].feat == '\x16')) {
                uVar4 = (uint)borg_temp_n;
                uVar7 = (ulong)uVar4;
                uVar9 = 0;
                if (0 < borg_temp_n) {
                  do {
                    if ((uVar13 == borg_temp_y[uVar9]) && (uVar14 == borg_temp_x[uVar9]))
                    goto LAB_00245da8;
                    uVar9 = uVar9 + 1;
                  } while (uVar7 != uVar9);
                  uVar9 = (ulong)uVar4;
                }
LAB_00245da8:
                if ((uint)uVar9 < 9000 && (uint)uVar9 == uVar4) {
                  borg_temp_x[uVar7] = (uint8_t)uVar14;
                  borg_temp_y[uVar7] = (uint8_t)uVar13;
                  borg_temp_n = borg_temp_n + 1;
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != 8);
          }
          uVar14 = uVar14 + 1;
          ptVar8 = Term;
          wVar3 = w_y;
        } while ((long)uVar14 <
                 (long)((~col_map[Term->sidebar_mode] + Term->wid) / (int)(uint)tile_width) +
                 (long)w_x);
      }
    }
    if (0 < borg_temp_n) {
      lVar10 = 0;
      do {
        _Var2 = borg_los(borg.c.y,borg.c.x,(uint)borg_temp_y[lVar10],(uint)borg_temp_x[lVar10]);
        if (_Var2) {
          lVar6 = loc((uint)borg_temp_x[lVar10],(uint)borg_temp_y[lVar10]);
          borg_target(lVar6);
          _Var2 = borg_spell(TURN_STONE_TO_MUD);
          if (((_Var2) || (_Var2 = borg_activate_ring(sv_ring_digging), _Var2)) ||
             (_Var2 = borg_activate_item(act_stone_to_mud), _Var2)) {
LAB_00245f48:
            borg_note("# Excavation of vault");
            borg_keypress(0x35);
            borg_do_update_view = true;
            borg_do_update_lite = true;
            borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info =
                 borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info & 0xfffd;
            borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info =
                 borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info | 2;
            borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].feat = '\x01';
            borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info =
                 borg_grids[borg_temp_y[lVar10]][borg_temp_x[lVar10]].info | 0x100;
            track_vein.num = 0;
            return true;
          }
          lVar6 = loc((uint)borg_temp_x[lVar10],(uint)borg_temp_y[lVar10]);
          lVar5.y = borg.c.y;
          lVar5.x = borg.c.x;
          wVar3 = distance(lVar5,lVar6);
          if ((wVar3 == L'\x01') && (_Var2 = borg_spell(SHATTER_STONE), _Var2)) goto LAB_00245f48;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < borg_temp_n);
    }
  }
  return false;
}

Assistant:

bool borg_excavate_vault(int range)
{
    int y, x, i, ii;
    int b_y, b_x;

    borg_grid *ag;

    /* reset counters */
    borg_temp_n = 0;
    i           = 0;
    ii          = 0;

    /* no need if no vault on level */
    if (!vault_on_level)
        return false;

    /* only if you can cast the spell */
    if (!borg_spell_okay_fail(TURN_STONE_TO_MUD, 30)
        && !borg_spell_okay_fail(SHATTER_STONE, 30))
        return false;

    /* Danger/bad idea checks */

    /* build the array -- Scan screen */
    for (y = w_y; y < w_y + SCREEN_HGT; y++) {
        for (x = w_x; x < w_x + SCREEN_WID; x++) {

            /* only bother with near ones */
            if (distance(borg.c, loc(x, y)) > range)
                continue;

            /* only deal with excavatable walls */
            if (borg_grids[y][x].feat != FEAT_GRANITE
                && borg_grids[y][x].feat != FEAT_RUBBLE
                && borg_grids[y][x].feat != FEAT_QUARTZ
                && borg_grids[y][x].feat != FEAT_MAGMA
                && borg_grids[y][x].feat != FEAT_QUARTZ_K
                && borg_grids[y][x].feat != FEAT_MAGMA_K)
                continue;

            /* Examine grids adjacent to this grid to see if there is a perma
             * wall adjacent */
            for (i = 0; i < 8; i++) {
                b_x = x + ddx_ddd[i];
                b_y = y + ddy_ddd[i];

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(b_x, b_y)))
                    continue;

                ag = &borg_grids[b_y][b_x];

                /* Not a perma, and not our spot. */
                if (ag->feat != FEAT_PERM)
                    continue;

                /* Track the new grid */
                for (ii = 0; ii < borg_temp_n; ii++) {
                    if (borg_temp_y[ii] == y && borg_temp_x[ii] == x)
                        break;
                }

                /* Track the newly discovered excavatable wall */
                if ((ii == borg_temp_n) && (ii < AUTO_TEMP_MAX)) {
                    borg_temp_x[ii] = x;
                    borg_temp_y[ii] = y;
                    borg_temp_n++;
                }
            }
        }
    }

    /* None to excavate */
    if (!borg_temp_n)
        return false;

    /* Review the useful grids */
    for (i = 0; i < borg_temp_n; i++) {
        /* skip non-projectable grids grid (I cant shoot them) */
        if (!borg_los(borg.c.y, borg.c.x, borg_temp_y[i], borg_temp_x[i]))
            continue;

        /* Attempt to target the grid */
        borg_target(loc(borg_temp_x[i], borg_temp_y[i]));

        /* Attempt to excavate it with "stone to mud" */
        if (borg_spell(TURN_STONE_TO_MUD) 
            || borg_activate_ring(sv_ring_digging)
            || borg_activate_item(act_stone_to_mud)
            || (distance(borg.c, loc(borg_temp_x[i], borg_temp_y[i])) == 1 
                && borg_spell(SHATTER_STONE))
            ) {
            borg_note("# Excavation of vault");
            borg_keypress('5');

            /* turn that wall into a floor grid.  If the spell failed and the
             * grid is visible, it will still look like a wall and the
             * borg_update routine will redefine it as a wall
             */
            borg_do_update_view = true;
            borg_do_update_lite = true;

            /* Not Lit */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info &= ~BORG_GLOW;
            /* Dark */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info |= BORG_GLOW;
            /* Feat Floor */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].feat = FEAT_FLOOR;
            /*
             * If the grid is not seen, prefer what the borg remembers over
             * what map_info() returns (i.e. optimistically assume that the
             * excavation was successful.
             */
            borg_grids[borg_temp_y[i]][borg_temp_x[i]].info |= BORG_IGNORE_MAP;
            /* Forget number of mineral veins to force rebuild of vein list */
            track_vein.num = 0;

            return true;
        }
    }

    /* No grid to excavate */
    return false;
}